

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRename
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  string newname;
  string oldname;
  string err;
  ostringstream e;
  char *local_218 [4];
  char *local_1f8 [4];
  string local_1d8;
  string local_1b8 [32];
  ostream local_198;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    std::__cxx11::string::string((string *)local_1f8,(string *)(pbVar1 + 1));
    bVar2 = cmsys::SystemTools::FileIsFullPath(local_1f8[0]);
    if (!bVar2) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)local_1f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                     ,"/",(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
      std::__cxx11::string::append((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_198);
    }
    std::__cxx11::string::string
              ((string *)local_218,
               (string *)
               ((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 2));
    bVar2 = cmsys::SystemTools::FileIsFullPath(local_218[0]);
    if (!bVar2) {
      cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      std::__cxx11::string::assign((char *)local_218);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198
                     ,"/",(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 2);
      std::__cxx11::string::append((string *)local_218);
      std::__cxx11::string::~string((string *)&local_198);
    }
    bVar2 = cmSystemTools::RenameFile(local_1f8[0],local_218[0]);
    if (!bVar2) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar3 = std::operator<<(&local_198,"RENAME failed to rename\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)local_1f8);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"to\n");
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = std::operator<<(poVar3,(string *)local_218);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"because: ");
      poVar3 = std::operator<<(poVar3,local_1b8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::__cxx11::string::~string(local_1b8);
    }
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_198,"RENAME given incorrect number of arguments.",
               (allocator *)local_1f8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleRename(std::vector<std::string> const& args)
{
  if(args.size() != 3)
    {
    this->SetError("RENAME given incorrect number of arguments.");
    return false;
    }

  // Compute full path for old and new names.
  std::string oldname = args[1];
  if(!cmsys::SystemTools::FileIsFullPath(oldname.c_str()))
    {
    oldname = this->Makefile->GetCurrentSourceDirectory();
    oldname += "/" + args[1];
    }
  std::string newname = args[2];
  if(!cmsys::SystemTools::FileIsFullPath(newname.c_str()))
    {
    newname = this->Makefile->GetCurrentSourceDirectory();
    newname += "/" + args[2];
    }

  if(!cmSystemTools::RenameFile(oldname.c_str(), newname.c_str()))
    {
    std::string err = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "RENAME failed to rename\n"
      << "  " << oldname << "\n"
      << "to\n"
      << "  " << newname << "\n"
      << "because: " << err << "\n";
    this->SetError(e.str());
    return false;
    }
  return true;
}